

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USS.h
# Opt level: O2

int __thiscall USS<4U>::Query(USS<4U> *this,Data<4U> *item)

{
  count_type cVar1;
  
  cVar1 = StreamSummary<4U>::Query(this->summary,item);
  return cVar1;
}

Assistant:

int Query(const Data<DATA_LEN>& item) { return summary->Query(item); }